

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomcp.cpp
# Opt level: O2

void __thiscall despot::DPOMCP::BeliefUpdate(DPOMCP *this,ACT_TYPE action,OBS_TYPE obs)

{
  Belief *pBVar1;
  int iVar2;
  log_ostream *plVar3;
  ostream *poVar4;
  double dVar5;
  double dVar6;
  
  dVar5 = get_time_second();
  History::Add(&(this->super_POMCP).super_Solver.history_,action,obs);
  pBVar1 = (this->super_POMCP).super_Solver.belief_;
  (*pBVar1->_vptr_Belief[3])(pBVar1,action,obs);
  iVar2 = logging::level();
  if (0 < iVar2) {
    iVar2 = logging::level();
    if (2 < iVar2) {
      plVar3 = logging::stream(3);
      poVar4 = std::operator<<(&plVar3->super_ostream,
                               "[DPOMCP::Update] Updated belief, history and root with action ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,action);
      poVar4 = std::operator<<(poVar4,", observation ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," in ");
      dVar6 = get_time_second();
      poVar4 = std::ostream::_M_insert<double>(dVar6 - dVar5);
      poVar4 = std::operator<<(poVar4,"s");
      std::endl<char,std::char_traits<char>>(poVar4);
      return;
    }
  }
  return;
}

Assistant:

void DPOMCP::BeliefUpdate(ACT_TYPE action, OBS_TYPE obs) {
	double start = get_time_second();

	history_.Add(action, obs);
	belief_->Update(action, obs);

	logi << "[DPOMCP::Update] Updated belief, history and root with action "
		<< action << ", observation " << obs
		<< " in " << (get_time_second() - start) << "s" << endl;
}